

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O2

bool __thiscall EefcFlash::getBor(EefcFlash *this)

{
  uint32_t uVar1;
  
  if (this->_canBrownout == true) {
    waitFSR(this,1);
    writeFCR0(this,'\r',0);
    waitFSR(this,1);
    uVar1 = readFRR0(this);
    return SUB41((uVar1 & 4) >> 2,0);
  }
  return false;
}

Assistant:

bool
EefcFlash::getBor()
{
    if (!_canBrownout)
        return false;

    waitFSR();
    writeFCR0(EEFC_FCMD_GGPB, 0);
    waitFSR();
    return (readFRR0() & (1 << 2));
}